

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O1

void __thiscall Merlin::check(Merlin *this)

{
  size_t sVar1;
  runtime_error *prVar2;
  ulong uVar3;
  string err_msg;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  sVar1 = this->m_task;
  if ((long)sVar1 < 0x1e) {
    if (sVar1 == 10) {
      if ((this->m_algorithm != 0x3ec) && (this->m_algorithm != 0x3f0)) {
        local_38[0] = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_38,"For PR inference use WMB and BTE algorithms.","");
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,(string *)local_38);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if (sVar1 != 0x14) {
LAB_0015c79b:
        local_38[0] = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_38,"Supported inference tasks are PR, MAR, MAP and MMAP.","");
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,(string *)local_38);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar3 = this->m_algorithm - 1000;
      if ((9 < uVar3) || ((0x317UL >> (uVar3 & 0x3f) & 1) == 0)) {
        local_38[0] = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_38,
                   "For MAR inference use WMB, IJGP, LBP, BTE, CTE and GIBBS algorithms.","");
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,(string *)local_38);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else if (sVar1 == 0x1e) {
    uVar3 = this->m_algorithm - 1000;
    if ((8 < uVar3) || ((0x11dUL >> (uVar3 & 0x3f) & 1) == 0)) {
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,"For MAP inference use WMB, JGLP, IJGP and GIBBS algorithms.",""
                );
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,(string *)local_38);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (sVar1 == 0x28) {
    if ((this->m_algorithm != 0x3ec) && (this->m_algorithm != 0x3f0)) {
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,"For MMAP inference use WMB and BTE algorithms.","");
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,(string *)local_38);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (sVar1 != 0x32) goto LAB_0015c79b;
    if ((1 < this->m_algorithm - 0x3f0) && (this->m_algorithm != 0x3ec)) {
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,"For EM learning use WMB, CTE and BTE inference algorithms.","")
      ;
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,(string *)local_38);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void Merlin::check() {
	if (m_task == MERLIN_TASK_PR) {
		if (m_algorithm != MERLIN_ALGO_WMB &&
			m_algorithm != MERLIN_ALGO_BTE) {
			std::string err_msg("For PR inference use WMB and BTE algorithms.");
			throw std::runtime_error(err_msg);
		}
	} else if (m_task == MERLIN_TASK_MAR) {
		if (m_algorithm != MERLIN_ALGO_WMB &&
				m_algorithm != MERLIN_ALGO_IJGP &&
				m_algorithm != MERLIN_ALGO_LBP &&
				m_algorithm != MERLIN_ALGO_GIBBS &&
				m_algorithm != MERLIN_ALGO_BTE &&
				m_algorithm != MERLIN_ALGO_CTE) {
			std::string err_msg("For MAR inference use WMB, IJGP, LBP, BTE, CTE and GIBBS algorithms.");
			throw std::runtime_error(err_msg);
		}
	} else if (m_task == MERLIN_TASK_MAP) {
		if (m_algorithm != MERLIN_ALGO_WMB &&
				m_algorithm != MERLIN_ALGO_JGLP &&
				m_algorithm != MERLIN_ALGO_IJGP &&
				m_algorithm != MERLIN_ALGO_GIBBS &&
				m_algorithm != MERLIN_ALGO_BTE) {
			std::string err_msg("For MAP inference use WMB, JGLP, IJGP and GIBBS algorithms.");
			throw std::runtime_error(err_msg);
		}
	} else if (m_task == MERLIN_TASK_MMAP) {
		if (m_algorithm != MERLIN_ALGO_WMB &&
			m_algorithm != MERLIN_ALGO_BTE) {
			std::string err_msg("For MMAP inference use WMB and BTE algorithms.");
			throw std::runtime_error(err_msg);
		}
	} else if (m_task == MERLIN_TASK_EM) {
		if (m_algorithm != MERLIN_ALGO_CTE &&
			m_algorithm != MERLIN_ALGO_BTE &&
			m_algorithm != MERLIN_ALGO_WMB) {
			std::string err_msg("For EM learning use WMB, CTE and BTE inference algorithms.");
			throw std::runtime_error(err_msg);
		}
	} else {
		std::string err_msg("Supported inference tasks are PR, MAR, MAP and MMAP.");
		throw std::runtime_error(err_msg);
	}
}